

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeIncrPopulate(IncrMerger *pIncr)

{
  uint nData;
  MergeEngine *pMVar1;
  sqlite3_file *psVar2;
  PmaReader *pPVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  u64 v;
  PmaWriter writer;
  int dummy;
  u8 aByte [10];
  PmaWriter local_78;
  long local_48;
  int local_40;
  uchar local_3a [10];
  
  lVar7 = pIncr->iStartOff;
  pMVar1 = pIncr->pMerger;
  psVar2 = pIncr->aFile[1].pFd;
  iVar6 = pIncr->pTask->pSorter->pgsz;
  local_78.iWriteOff = 0;
  local_78.pFd = (sqlite3_file *)0x0;
  local_78.nBuffer = 0;
  local_78.iBufStart = 0;
  local_78.iBufEnd = 0;
  local_78._28_4_ = 0;
  local_78.eFWErr = 0;
  local_78._4_4_ = 0;
  local_78.aBuffer = (u8 *)0x0;
  local_78.aBuffer = (u8 *)sqlite3Malloc((long)iVar6);
  if (local_78.aBuffer == (u8 *)0x0) {
    local_78.eFWErr = 7;
  }
  else {
    local_78.iWriteOff = lVar7 % (long)iVar6;
    iVar5 = (int)local_78.iWriteOff;
    local_78.iBufEnd = iVar5;
    local_78.iWriteOff = lVar7 - local_78.iWriteOff;
    local_78.iBufStart = iVar5;
    local_78.nBuffer = iVar6;
    local_78.pFd = psVar2;
  }
  local_48 = lVar7;
  while( true ) {
    pPVar3 = pMVar1->aReadr;
    iVar6 = pMVar1->aTree[1];
    if (pPVar3[iVar6].pFd == (sqlite3_file *)0x0) break;
    nData = pPVar3[iVar6].nKey;
    v = (u64)(int)nData;
    lVar7 = 1;
    uVar8 = v;
    if (0x7f < nData) {
      do {
        lVar7 = lVar7 + 1;
        bVar4 = 0x3fff < uVar8;
        uVar8 = uVar8 >> 7;
      } while (bVar4);
    }
    if (pIncr->mxSz + local_48 < (long)(local_78.iWriteOff + v + (long)local_78.iBufEnd + lVar7))
    break;
    iVar5 = sqlite3PutVarint(local_3a,v);
    vdbePmaWriteBlob(&local_78,local_3a,iVar5);
    vdbePmaWriteBlob(&local_78,pPVar3[iVar6].aKey,nData);
    iVar6 = vdbeMergeEngineStep(pIncr->pMerger,&local_40);
    if (iVar6 != 0) {
      vdbePmaWriterFinish(&local_78,&pIncr->aFile[1].iEof);
      return iVar6;
    }
  }
  iVar6 = vdbePmaWriterFinish(&local_78,&pIncr->aFile[1].iEof);
  return iVar6;
}

Assistant:

static int vdbeIncrPopulate(IncrMerger *pIncr){
  int rc = SQLITE_OK;
  int rc2;
  i64 iStart = pIncr->iStartOff;
  SorterFile *pOut = &pIncr->aFile[1];
  SortSubtask *pTask = pIncr->pTask;
  MergeEngine *pMerger = pIncr->pMerger;
  PmaWriter writer;
  assert( pIncr->bEof==0 );

  vdbeSorterPopulateDebug(pTask, "enter");

  vdbePmaWriterInit(pOut->pFd, &writer, pTask->pSorter->pgsz, iStart);
  while( rc==SQLITE_OK ){
    int dummy;
    PmaReader *pReader = &pMerger->aReadr[ pMerger->aTree[1] ];
    int nKey = pReader->nKey;
    i64 iEof = writer.iWriteOff + writer.iBufEnd;

    /* Check if the output file is full or if the input has been exhausted.
    ** In either case exit the loop. */
    if( pReader->pFd==0 ) break;
    if( (iEof + nKey + sqlite3VarintLen(nKey))>(iStart + pIncr->mxSz) ) break;

    /* Write the next key to the output. */
    vdbePmaWriteVarint(&writer, nKey);
    vdbePmaWriteBlob(&writer, pReader->aKey, nKey);
    assert( pIncr->pMerger->pTask==pTask );
    rc = vdbeMergeEngineStep(pIncr->pMerger, &dummy);
  }

  rc2 = vdbePmaWriterFinish(&writer, &pOut->iEof);
  if( rc==SQLITE_OK ) rc = rc2;
  vdbeSorterPopulateDebug(pTask, "exit");
  return rc;
}